

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

RangeListSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::RangeListSyntax,slang::syntax::RangeListSyntax_const&>
          (BumpAllocator *this,RangeListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  RangeListSyntax *pRVar8;
  
  pRVar8 = (RangeListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RangeListSyntax *)this->endPtr < pRVar8 + 1) {
    pRVar8 = (RangeListSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pRVar8 + 1);
  }
  (pRVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pRVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pRVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pRVar8->super_SyntaxNode).parent = pSVar1;
  uVar5 = (args->openBrace).field_0x2;
  NVar6.raw = (args->openBrace).numFlags.raw;
  uVar7 = (args->openBrace).rawLen;
  pIVar2 = (args->openBrace).info;
  (pRVar8->openBrace).kind = (args->openBrace).kind;
  (pRVar8->openBrace).field_0x2 = uVar5;
  (pRVar8->openBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pRVar8->openBrace).rawLen = uVar7;
  (pRVar8->openBrace).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->valueRanges).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->valueRanges).super_SyntaxListBase.super_SyntaxNode.parent;
  (pRVar8->valueRanges).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->valueRanges).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pRVar8->valueRanges).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pRVar8->valueRanges).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pRVar8->valueRanges).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->valueRanges).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pRVar8->valueRanges).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e5cf8;
  (pRVar8->valueRanges).super_SyntaxListBase.childCount =
       (args->valueRanges).super_SyntaxListBase.childCount;
  (pRVar8->valueRanges).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005e62d0;
  sVar3 = (args->valueRanges).elements._M_extent._M_extent_value;
  (pRVar8->valueRanges).elements._M_ptr = (args->valueRanges).elements._M_ptr;
  (pRVar8->valueRanges).elements._M_extent._M_extent_value = sVar3;
  uVar5 = (args->closeBrace).field_0x2;
  NVar6.raw = (args->closeBrace).numFlags.raw;
  uVar7 = (args->closeBrace).rawLen;
  pIVar2 = (args->closeBrace).info;
  (pRVar8->closeBrace).kind = (args->closeBrace).kind;
  (pRVar8->closeBrace).field_0x2 = uVar5;
  (pRVar8->closeBrace).numFlags = (NumericTokenFlags)NVar6.raw;
  (pRVar8->closeBrace).rawLen = uVar7;
  (pRVar8->closeBrace).info = pIVar2;
  return pRVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }